

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# push_subface.c
# Opt level: O3

void prf_push_subface_entry_f(prf_node_t *node,prf_state_t *state)

{
  if (node->opcode == prf_push_subface_info.opcode) {
    state->subface_level = state->subface_level + 1;
    return;
  }
  prf_error(9,"tried push subface entry state method on node of type %d.");
  return;
}

Assistant:

static
void
prf_push_subface_entry_f(
    prf_node_t * node,
    prf_state_t * state )
{
    assert( node != NULL && state != NULL );

    if ( node->opcode != prf_push_subface_info.opcode ) {
        prf_error( 9,
            "tried push subface entry state method on node of type %d.",
            node->opcode );
        return;
    }

    state->subface_level++;
}